

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O1

fp duckdb_fmt::v6::internal::get_cached_power(int min_exponent,int *pow10_exponent)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  fp fVar4;
  
  iVar1 = (int)((ulong)((long)(min_exponent + 0x3f) * 0x4d104d42 + 0xffffffff) >> 0x20);
  uVar3 = iVar1 + 0x15b;
  uVar2 = iVar1 + 0x162;
  if (-1 < (int)uVar3) {
    uVar2 = uVar3;
  }
  *pow10_exponent = (uVar2 & 0xfffffff8) - 0x154;
  fVar4.e = (int)*(short *)(basic_data<void>::pow10_exponents + (long)((int)uVar2 >> 3) * 2 + 2);
  fVar4.f = *(undefined8 *)(basic_data<void>::pow10_significands + (long)((int)uVar2 >> 3) * 8 + 8);
  fVar4._12_4_ = 0;
  return fVar4;
}

Assistant:

FMT_FUNC fp get_cached_power(int min_exponent, int& pow10_exponent) {
  const uint64_t one_over_log2_10 = 0x4d104d42;  // round(pow(2, 32) / log2(10))
  int index = static_cast<int>(
      static_cast<int64_t>(
          (min_exponent + fp::significand_size - 1) * one_over_log2_10 +
          ((uint64_t(1) << 32) - 1)  // ceil
          ) >>
      32  // arithmetic shift
  );
  // Decimal exponent of the first (smallest) cached power of 10.
  const int first_dec_exp = -348;
  // Difference between 2 consecutive decimal exponents in cached powers of 10.
  const int dec_exp_step = 8;
  index = (index - first_dec_exp - 1) / dec_exp_step + 1;
  pow10_exponent = first_dec_exp + index * dec_exp_step;
  return {data::pow10_significands[index], data::pow10_exponents[index]};
}